

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
consistentProperty(pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,string *lhs,string *rhs,CompatibleType t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s2;
  cmValue *this;
  cmValue *pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  size_type *psVar7;
  string *extraout_RDX;
  string *extraout_RDX_00;
  char *extraout_RDX_01;
  string_view value;
  string_view value_00;
  pair<bool,_const_char_*> pVar8;
  string null_ptr;
  allocator<char> local_71;
  undefined4 *local_70;
  long local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  string local_50;
  
  __s2 = &local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_4_ = 0x736e7528;
  local_50._M_string_length = 7;
  local_50.field_2._M_allocated_capacity._4_4_ = 0x297465;
  this = (cmValue *)lhs->_M_string_length;
  psVar6 = rhs;
  local_50._M_dataplus._M_p = (pointer)__s2;
  if (this == (cmValue *)0x7) {
    iVar5 = bcmp((lhs->_M_dataplus)._M_p,__s2,7);
    if (((iVar5 == 0) && (rhs->_M_string_length == 7)) &&
       (iVar5 = bcmp((rhs->_M_dataplus)._M_p,__s2,7), iVar5 == 0)) {
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      pcVar2 = (lhs->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,pcVar2,pcVar2 + 7);
      goto LAB_003f7e34;
    }
    iVar5 = bcmp((lhs->_M_dataplus)._M_p,__s2,7);
    psVar6 = extraout_RDX;
    if (iVar5 == 0) {
      __return_storage_ptr__->first = true;
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      pcVar2 = (rhs->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->second,pcVar2,pcVar2 + rhs->_M_string_length);
      goto LAB_003f7e34;
    }
  }
  pcVar1 = (cmValue *)rhs->_M_string_length;
  if ((pcVar1 == (cmValue *)0x7) &&
     (iVar5 = bcmp((rhs->_M_dataplus)._M_p,&local_50.field_2,7), psVar6 = extraout_RDX_00,
     iVar5 == 0)) {
    __return_storage_ptr__->first = true;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    pcVar2 = (lhs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,pcVar2,
               (pointer)((long)&this->Value + (long)pcVar2));
  }
  else if (t - NumberMinType < 2) {
    pVar8 = consistentNumberProperty((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,t);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pVar8.second,&local_71)
      ;
    }
    __return_storage_ptr__->first = pVar8.first;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,local_70,local_68 + (long)local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT44(uStack_5c,local_60) + 1);
    }
  }
  else if (t == StringType) {
    if (this == pcVar1) {
      if (this == (cmValue *)0x0) {
        bVar3 = true;
      }
      else {
        iVar5 = bcmp((lhs->_M_dataplus)._M_p,(rhs->_M_dataplus)._M_p,(size_t)this);
        bVar3 = iVar5 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    local_70 = &local_60;
    if (bVar3 == false) {
      local_60 = 0x736e7528;
      local_68 = 7;
      uStack_5c = 0x297465;
    }
    else {
      pcVar2 = (lhs->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,(pointer)((long)&this->Value + (long)pcVar2));
    }
    __return_storage_ptr__->first = bVar3;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,local_70,local_68 + (long)local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT44(uStack_5c,local_60) + 1);
    }
  }
  else {
    if (t != BoolType) {
      __assert_fail("false && \"Unreachable!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmGeneratorTarget.cxx"
                    ,0x17e3,
                    "std::pair<bool, std::string> consistentProperty(const std::string &, const std::string &, CompatibleType)"
                   );
    }
    value._M_str = (char *)psVar6;
    value._M_len = (size_t)(lhs->_M_dataplus)._M_p;
    bVar3 = cmValue::IsOn(this,value);
    value_00._M_str = extraout_RDX_01;
    value_00._M_len = (size_t)(rhs->_M_dataplus)._M_p;
    bVar4 = cmValue::IsOn((cmValue *)rhs->_M_string_length,value_00);
    bVar3 = bVar4 == bVar3;
    __return_storage_ptr__->first = bVar3;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    psVar6 = &local_50;
    if (bVar3) {
      psVar6 = lhs;
    }
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    psVar7 = &local_50._M_string_length;
    if (bVar3) {
      psVar7 = &lhs->_M_string_length;
    }
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->second,pcVar2,pcVar2 + *psVar7);
  }
LAB_003f7e34:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT44(local_50.field_2._M_allocated_capacity._4_4_,
                             local_50.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::pair<bool, std::string> consistentProperty(const std::string& lhs,
                                                       const std::string& rhs,
                                                       CompatibleType t)
{
  const std::string null_ptr = valueAsString(nullptr);

  if (lhs == null_ptr && rhs == null_ptr) {
    return { true, lhs };
  }
  if (lhs == null_ptr) {
    return { true, rhs };
  }
  if (rhs == null_ptr) {
    return { true, lhs };
  }

  switch (t) {
    case BoolType: {
      bool same = cmIsOn(lhs) == cmIsOn(rhs);
      return { same, same ? lhs : null_ptr };
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType: {
      auto value = consistentNumberProperty(lhs.c_str(), rhs.c_str(), t);
      return { value.first,
               value.first ? std::string(value.second) : null_ptr };
    }
  }
  assert(false && "Unreachable!");
  return { false, null_ptr };
}